

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsEndpointSetOption(HelicsEndpoint end,int option,int value,HelicsError *err)

{
  EndpointObject *pEVar1;
  uint in_EDX;
  uint in_ESI;
  EndpointObject *endObj;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsEndpoint in_stack_ffffffffffffffd8;
  
  pEVar1 = anon_unknown.dwarf_784a3::verifyEndpoint
                     (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pEVar1 != (EndpointObject *)0x0) {
    (*(pEVar1->endPtr->super_Interface)._vptr_Interface[2])
              (pEVar1->endPtr,(ulong)in_ESI,(ulong)in_EDX);
  }
  return;
}

Assistant:

void helicsEndpointSetOption(HelicsEndpoint end, int option, int value, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}